

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

void Hop_ObjDelete_rec(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pObj_00;
  Hop_Obj_t *pObj_01;
  Hop_Obj_t *pFanin1;
  Hop_Obj_t *pFanin0;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0xd9,"void Hop_ObjDelete_rec(Hop_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsConst1(pObj);
  if ((iVar1 == 0) && (iVar1 = Hop_ObjIsPi(pObj), iVar1 == 0)) {
    iVar1 = Hop_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Hop_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                    ,0xdc,"void Hop_ObjDelete_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    pObj_00 = Hop_ObjFanin0(pObj);
    pObj_01 = Hop_ObjFanin1(pObj);
    Hop_ObjDelete(p,pObj);
    if (((pObj_00 != (Hop_Obj_t *)0x0) && (iVar1 = Hop_ObjIsNone(pObj_00), iVar1 == 0)) &&
       (iVar1 = Hop_ObjRefs(pObj_00), iVar1 == 0)) {
      Hop_ObjDelete_rec(p,pObj_00);
    }
    if (((pObj_01 != (Hop_Obj_t *)0x0) && (iVar1 = Hop_ObjIsNone(pObj_01), iVar1 == 0)) &&
       (iVar1 = Hop_ObjRefs(pObj_01), iVar1 == 0)) {
      Hop_ObjDelete_rec(p,pObj_01);
    }
  }
  return;
}

Assistant:

void Hop_ObjDelete_rec( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t * pFanin0, * pFanin1;
    assert( !Hop_IsComplement(pObj) );
    if ( Hop_ObjIsConst1(pObj) || Hop_ObjIsPi(pObj) )
        return;
    assert( Hop_ObjIsNode(pObj) );
    pFanin0 = Hop_ObjFanin0(pObj);
    pFanin1 = Hop_ObjFanin1(pObj);
    Hop_ObjDelete( p, pObj );
    if ( pFanin0 && !Hop_ObjIsNone(pFanin0) && Hop_ObjRefs(pFanin0) == 0 )
        Hop_ObjDelete_rec( p, pFanin0 );
    if ( pFanin1 && !Hop_ObjIsNone(pFanin1) && Hop_ObjRefs(pFanin1) == 0 )
        Hop_ObjDelete_rec( p, pFanin1 );
}